

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  uchar uVar2;
  short sVar3;
  stbi__uint32 sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined4 uVar7;
  stbi__uint32 *psVar8;
  stbi__uint32 *psVar9;
  stbi__int16 (*pasVar10) [512];
  stbi_uc sVar11;
  byte bVar12;
  stbi_uc sVar13;
  stbi_uc sVar14;
  stbi_uc sVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  stbi__uint32 sVar22;
  int iVar23;
  stbi__jpeg *j;
  stbi__jpeg *z;
  long lVar24;
  stbi__context *psVar25;
  stbi__uint16 *data_00;
  uchar *data_01;
  void *pvVar26;
  code *pcVar27;
  float *data_02;
  long lVar28;
  stbi_uc *psVar29;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar30;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  undefined8 extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar31;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 uVar32;
  undefined7 uVar34;
  stbi_uc *extraout_RDX_18;
  stbi_uc *extraout_RDX_19;
  stbi_uc *extraout_RDX_20;
  undefined1 auVar33 [8];
  short *psVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 *puVar38;
  byte *pbVar39;
  char cVar40;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  ulong uVar41;
  int iVar42;
  int iVar43;
  stbi__uint16 *psVar44;
  uint n;
  stbi_uc (*pasVar45) [4];
  uint uVar46;
  int *piVar47;
  uint uVar48;
  bool bVar49;
  undefined1 auVar50 [16];
  stbi_uc *coutput [4];
  short data [64];
  void *local_8988;
  uint local_8978;
  uint local_8970;
  uint local_8960;
  uint local_8934;
  uint local_8924;
  undefined1 local_8918 [8];
  undefined8 uStack_8910;
  undefined8 local_8908;
  undefined8 uStack_8900;
  stbi__uint32 *local_88f8;
  stbi__uint32 *local_88f0;
  stbi__int16 (*local_88e8) [512];
  uint local_88dc;
  int *local_88d8;
  undefined8 local_88d0;
  uint local_88c4;
  ulong local_88c0;
  stbi__uint32 local_88b4;
  uint local_88b0;
  int local_88ac;
  stbi__gif local_88a8;
  
  psVar29 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  local_88f8 = (stbi__uint32 *)x;
  local_88f0 = (stbi__uint32 *)y;
  local_88d8 = comp;
  j = (stbi__jpeg *)malloc(0x4888);
  j->s = s;
  j->idct_block_kernel = stbi__idct_simd;
  j->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  j->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  j->jfif = 0;
  j->app14_color_transform = -1;
  j->marker = 0xff;
  sVar11 = stbi__get_marker(j);
  if (sVar11 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(j);
  if (sVar11 == 0xd8) {
    z = (stbi__jpeg *)malloc(0x4888);
    z->s = s;
    z->idct_block_kernel = stbi__idct_simd;
    z->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    z->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = z->img_comp;
      lVar24 = 0x46d8;
      do {
        psVar29 = z->huff_dc[0].fast + lVar24 + -8;
        psVar29[0] = '\0';
        psVar29[1] = '\0';
        psVar29[2] = '\0';
        psVar29[3] = '\0';
        psVar29[4] = '\0';
        psVar29[5] = '\0';
        psVar29[6] = '\0';
        psVar29[7] = '\0';
        psVar29[8] = '\0';
        psVar29[9] = '\0';
        psVar29[10] = '\0';
        psVar29[0xb] = '\0';
        psVar29[0xc] = '\0';
        psVar29[0xd] = '\0';
        psVar29[0xe] = '\0';
        psVar29[0xf] = '\0';
        lVar24 = lVar24 + 0x60;
      } while (lVar24 != 0x4858);
      z->restart_interval = 0;
      iVar17 = stbi__decode_jpeg_header(z,0);
      uVar48 = extraout_EDX;
      if (iVar17 != 0) {
        bVar12 = stbi__get_marker(z);
        local_88e8 = z->fast_ac;
        uVar32 = extraout_RDX;
        do {
          if (bVar12 != 0xda) {
            if (bVar12 == 0xdc) {
              psVar25 = z->s;
              sVar11 = stbi__get8(psVar25);
              sVar13 = stbi__get8(psVar25);
              j = (stbi__jpeg *)(ulong)(uint)CONCAT11(sVar11,sVar13);
              psVar25 = z->s;
              sVar14 = stbi__get8(psVar25);
              sVar15 = stbi__get8(psVar25);
              paVar31 = extraout_RDX_00;
              if (CONCAT11(sVar11,sVar13) == 4) {
                if ((uint)CONCAT11(sVar14,sVar15) == z->s->img_y) goto LAB_0017522b;
                stbi__g_failure_reason = "bad DNL height";
              }
              else {
                stbi__g_failure_reason = "bad DNL len";
              }
              goto LAB_00176126;
            }
            if (bVar12 == 0xd9) {
              if ((z->progressive != 0) && (0 < z->s->img_n)) {
                lVar24 = 0;
                do {
                  iVar17 = z->img_comp[lVar24].y + 7 >> 3;
                  if (0 < iVar17) {
                    uVar48 = paVar1[lVar24].x + 7 >> 3;
                    iVar43 = 0;
                    do {
                      if (0 < (int)uVar48) {
                        uVar36 = 0;
                        do {
                          psVar35 = paVar1[lVar24].coeff +
                                    (paVar1[lVar24].coeff_w * iVar43 + (int)uVar36) * 0x40;
                          iVar42 = paVar1[lVar24].tq;
                          lVar28 = 0;
                          do {
                            psVar35[lVar28] = psVar35[lVar28] * z->dequant[iVar42][lVar28];
                            lVar28 = lVar28 + 1;
                          } while (lVar28 != 0x40);
                          (*z->idct_block_kernel)
                                    (paVar1[lVar24].data +
                                     uVar36 * 8 + (long)(iVar43 * 8 * paVar1[lVar24].w2),
                                     paVar1[lVar24].w2,psVar35);
                          uVar36 = uVar36 + 1;
                          uVar32 = extraout_RDX_17;
                        } while (uVar36 != uVar48);
                      }
                      iVar43 = iVar43 + 1;
                    } while (iVar43 != iVar17);
                  }
                  lVar24 = lVar24 + 1;
                } while (lVar24 < z->s->img_n);
              }
              if (req_comp == 0) {
                req_comp = (uint)(2 < z->s->img_n) * 2 + 1;
              }
              uVar48 = z->s->img_n;
              if (uVar48 == 3) {
                uVar34 = (undefined7)((ulong)uVar32 >> 8);
                uVar46 = (uint)CONCAT71(uVar34,1);
                if (z->rgb != 3) {
                  if (z->app14_color_transform != 0) goto LAB_0017589d;
                  uVar46 = (uint)CONCAT71(uVar34,z->jfif == 0);
                }
              }
              else {
LAB_0017589d:
                uVar46 = 0;
              }
              local_88e8 = (stbi__int16 (*) [512])CONCAT44(local_88e8._4_4_,uVar46);
              uVar18 = 1;
              if ((uVar46 & 1) != 0) {
                uVar18 = uVar48;
              }
              if (2 < req_comp) {
                uVar18 = uVar48;
              }
              if (uVar48 != 3) {
                uVar18 = uVar48;
              }
              local_8908 = (stbi_uc *)0x0;
              uStack_8900 = (stbi_uc *)0x0;
              local_8918 = (undefined1  [8])0x0;
              uStack_8910 = (stbi_uc *)0x0;
              if (0 < (int)uVar18) {
                local_8988 = (void *)0x0;
                lVar24 = 0;
                do {
                  psVar25 = z->s;
                  sVar22 = psVar25->img_x;
                  pvVar26 = malloc((ulong)(sVar22 + 3));
                  *(void **)((long)&z->img_comp[0].linebuf + lVar24 * 2) = pvVar26;
                  if (pvVar26 == (void *)0x0) {
                    stbi__free_jpeg_components(z,psVar25->img_n,why);
                    stbi__g_failure_reason = "outofmem";
                  }
                  else {
                    uVar36 = (long)z->img_h_max /
                             (long)*(int *)((long)&z->img_comp[0].h + lVar24 * 2);
                    iVar17 = (int)uVar36;
                    *(int *)((long)(local_88a8.pal + -7) + lVar24) = iVar17;
                    iVar43 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar24 * 2);
                    *(int *)((long)(local_88a8.pal + -6) + lVar24) = iVar43;
                    *(int *)((long)(local_88a8.pal + -4) + lVar24) = iVar43 >> 1;
                    *(int *)((long)(local_88a8.pal + -5) + lVar24) =
                         (int)((ulong)((sVar22 + iVar17) - 1) / (uVar36 & 0xffffffff));
                    *(undefined4 *)((long)(local_88a8.pal + -3) + lVar24) = 0;
                    uVar32 = *(undefined8 *)((long)&z->img_comp[0].data + lVar24 * 2);
                    *(undefined8 *)((long)(local_88a8.pal + -9) + lVar24) = uVar32;
                    *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar24) = uVar32;
                    if ((iVar17 == 1) && (iVar43 == 1)) {
                      pcVar27 = resample_row_1;
                    }
                    else if ((iVar17 == 1) && (iVar43 == 2)) {
                      pcVar27 = stbi__resample_row_v_2;
                    }
                    else if ((iVar17 == 2) && (iVar43 == 1)) {
                      pcVar27 = stbi__resample_row_h_2;
                    }
                    else if ((iVar17 == 2) && (iVar43 == 2)) {
                      pcVar27 = z->resample_row_hv_2_kernel;
                    }
                    else {
                      pcVar27 = stbi__resample_row_generic;
                    }
                    *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar24) = pcVar27;
                  }
                  if (pvVar26 == (void *)0x0) goto LAB_00176145;
                  lVar24 = lVar24 + 0x30;
                } while ((ulong)uVar18 * 0x30 != lVar24);
              }
              psVar25 = z->s;
              sVar22 = psVar25->img_y;
              local_8988 = stbi__malloc_mad3(req_comp,psVar25->img_x,sVar22,1);
              iVar17 = (int)extraout_RDX_18;
              if (local_8988 != (void *)0x0) {
                if (sVar22 != 0) {
                  iVar43 = 0;
                  uVar48 = 0;
                  auVar33 = (undefined1  [8])extraout_RDX_18;
                  do {
                    sVar22 = psVar25->img_x;
                    if (0 < (int)uVar18) {
                      pasVar45 = (stbi_uc (*) [4])&local_88a8.ratio;
                      uVar36 = 0;
                      piVar47 = &z->img_comp[0].y;
                      do {
                        asVar5 = pasVar45[-1];
                        asVar6 = pasVar45[-3];
                        iVar17 = (int)asVar6 >> 1;
                        auVar50 = (**(code **)(pasVar45 + -10))
                                            (*(stbi_uc **)(piVar47 + 10),
                                             *(undefined8 *)
                                              (*pasVar45 +
                                              ((ulong)(iVar17 <= (int)asVar5) << 3 |
                                              0xffffffffffffffe0)),
                                             *(undefined8 *)
                                              (*pasVar45 +
                                              ((ulong)((int)asVar5 < iVar17) << 3 |
                                              0xffffffffffffffe0)),pasVar45[-2]);
                        auVar33 = auVar50._8_8_;
                        *(long *)(local_8918 + uVar36 * 8) = auVar50._0_8_;
                        pasVar45[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                        if ((int)asVar6 <= (int)asVar5 + 1) {
                          pasVar45[-1] = (stbi_uc  [4])0x0;
                          *(stbi_uc **)(pasVar45 + -8) = *(stbi_uc **)(pasVar45 + -6);
                          asVar5 = *pasVar45;
                          *pasVar45 = (stbi_uc  [4])((int)asVar5 + 1);
                          if ((int)asVar5 + 1 < *piVar47) {
                            *(stbi_uc **)(pasVar45 + -6) = *(stbi_uc **)(pasVar45 + -6) + piVar47[1]
                            ;
                          }
                        }
                        uVar36 = uVar36 + 1;
                        piVar47 = piVar47 + 0x18;
                        pasVar45 = pasVar45 + 0xc;
                      } while (uVar18 != uVar36);
                    }
                    if (req_comp < 3) {
                      psVar25 = z->s;
                      if ((char)local_88e8 == '\0') {
                        if (psVar25->img_n == 4) {
                          if (z->app14_color_transform == 2) {
                            if (psVar25->img_x != 0) {
                              puVar38 = (undefined1 *)
                                        ((long)local_8988 + (ulong)(sVar22 * iVar43) + 1);
                              uVar36 = 0;
                              do {
                                iVar17 = (*(byte *)((long)local_8918 + uVar36) ^ 0xff) *
                                         (uint)uStack_8900[uVar36];
                                puVar38[-1] = (char)((iVar17 + 0x80U >> 8) + iVar17 + 0x80 >> 8);
                                *puVar38 = 0xff;
                                uVar36 = uVar36 + 1;
                                puVar38 = puVar38 + (uint)req_comp;
                                auVar33 = (undefined1  [8])uStack_8900;
                              } while (uVar36 < psVar25->img_x);
                            }
                          }
                          else {
                            if (z->app14_color_transform != 0) goto LAB_00175e68;
                            if (psVar25->img_x != 0) {
                              puVar38 = (undefined1 *)
                                        ((long)local_8988 + (ulong)(sVar22 * iVar43) + 1);
                              uVar36 = 0;
                              do {
                                bVar12 = uStack_8900[uVar36];
                                iVar17 = (uint)*(byte *)((long)local_8918 + uVar36) * (uint)bVar12;
                                iVar42 = (uint)uStack_8910[uVar36] * (uint)bVar12;
                                puVar38[-1] = (char)(((uint)local_8908[uVar36] * (uint)bVar12 +
                                                      ((uint)local_8908[uVar36] * (uint)bVar12 +
                                                       0x80 >> 8) + 0x80 >> 8 & 0xff) * 0x1d +
                                                     (iVar42 + (iVar42 + 0x80U >> 8) + 0x80 >> 8 &
                                                     0xff) * 0x96 +
                                                     (iVar17 + (iVar17 + 0x80U >> 8) + 0x80 >> 8 &
                                                     0xff) * 0x4d >> 8);
                                *puVar38 = 0xff;
                                uVar36 = uVar36 + 1;
                                puVar38 = puVar38 + (uint)req_comp;
                                auVar33 = local_8918;
                              } while (uVar36 < psVar25->img_x);
                            }
                          }
                        }
                        else {
LAB_00175e68:
                          uVar46 = psVar25->img_x;
                          auVar33 = (undefined1  [8])(ulong)uVar46;
                          if (req_comp == 1) {
                            if (uVar46 != 0) {
                              auVar33 = (undefined1  [8])0x0;
                              do {
                                *(stbi_uc *)
                                 ((long)auVar33 + (long)local_8988 + (ulong)(sVar22 * iVar43)) =
                                     *(stbi_uc *)((long)local_8918 + (long)auVar33);
                                auVar33 = (undefined1  [8])((long)auVar33 + 1);
                              } while ((ulong)auVar33 < (stbi_uc *)(ulong)psVar25->img_x);
                            }
                          }
                          else if (uVar46 != 0) {
                            auVar33 = (undefined1  [8])0x0;
                            do {
                              *(stbi_uc *)
                               ((long)local_8988 + (long)auVar33 * 2 + (ulong)(sVar22 * iVar43)) =
                                   *(stbi_uc *)((long)local_8918 + (long)auVar33);
                              *(undefined1 *)
                               ((long)local_8988 + (long)auVar33 * 2 + (ulong)(sVar22 * iVar43) + 1)
                                   = 0xff;
                              auVar33 = (undefined1  [8])((long)auVar33 + 1);
                            } while ((ulong)auVar33 < (stbi_uc *)(ulong)psVar25->img_x);
                          }
                        }
                      }
                      else if (req_comp == 1) {
                        if (psVar25->img_x != 0) {
                          uVar36 = 0;
                          do {
                            bVar12 = local_8908[uVar36];
                            *(char *)((long)local_8988 + uVar36 + sVar22 * iVar43) =
                                 (char)((uint)bVar12 * 2 + ((uint)bVar12 + (uint)bVar12 * 8) * 3 +
                                        (uint)uStack_8910[uVar36] * 0x96 +
                                        (uint)*(byte *)((long)local_8918 + uVar36) * 0x4d >> 8);
                            uVar36 = uVar36 + 1;
                            auVar33 = (undefined1  [8])uStack_8910;
                          } while (uVar36 < psVar25->img_x);
                        }
                      }
                      else if (psVar25->img_x != 0) {
                        uVar36 = 0;
                        do {
                          bVar12 = local_8908[uVar36];
                          *(char *)((long)local_8988 + uVar36 * 2 + (ulong)(sVar22 * iVar43)) =
                               (char)((uint)bVar12 * 2 + ((uint)bVar12 + (uint)bVar12 * 8) * 3 +
                                      (uint)uStack_8910[uVar36] * 0x96 +
                                      (uint)*(byte *)((long)local_8918 + uVar36) * 0x4d >> 8);
                          *(undefined1 *)
                           ((long)local_8988 + uVar36 * 2 + (ulong)(sVar22 * iVar43) + 1) = 0xff;
                          uVar36 = uVar36 + 1;
                          auVar33 = (undefined1  [8])uStack_8910;
                        } while (uVar36 < psVar25->img_x);
                      }
                    }
                    else {
                      psVar29 = (stbi_uc *)((long)local_8988 + (ulong)(uVar48 * req_comp * sVar22));
                      psVar25 = z->s;
                      if (psVar25->img_n == 3) {
                        if ((char)local_88e8 == '\0') {
LAB_00175edd:
                          (*z->YCbCr_to_RGB_kernel)
                                    (psVar29,(stbi_uc *)local_8918,uStack_8910,local_8908,
                                     psVar25->img_x,req_comp);
                          auVar33 = (undefined1  [8])extraout_RDX_19;
                        }
                        else if (psVar25->img_x != 0) {
                          puVar38 = (undefined1 *)((long)local_8988 + (ulong)(sVar22 * iVar43) + 3);
                          uVar36 = 0;
                          do {
                            puVar38[-3] = *(stbi_uc *)((long)local_8918 + uVar36);
                            puVar38[-2] = uStack_8910[uVar36];
                            puVar38[-1] = local_8908[uVar36];
                            *puVar38 = 0xff;
                            uVar36 = uVar36 + 1;
                            puVar38 = puVar38 + (uint)req_comp;
                            auVar33 = (undefined1  [8])local_8908;
                          } while (uVar36 < psVar25->img_x);
                        }
                      }
                      else if (psVar25->img_n == 4) {
                        if (z->app14_color_transform == 2) {
                          (*z->YCbCr_to_RGB_kernel)
                                    (psVar29,(stbi_uc *)local_8918,uStack_8910,local_8908,
                                     psVar25->img_x,req_comp);
                          psVar25 = z->s;
                          auVar33 = (undefined1  [8])extraout_RDX_20;
                          if (psVar25->img_x != 0) {
                            pbVar39 = (byte *)((long)local_8988 + (ulong)(sVar22 * iVar43) + 2);
                            auVar33 = (undefined1  [8])0x0;
                            do {
                              bVar12 = uStack_8900[(long)auVar33];
                              iVar17 = (pbVar39[-2] ^ 0xff) * (uint)bVar12;
                              pbVar39[-2] = (byte)((iVar17 + 0x80U >> 8) + iVar17 + 0x80 >> 8);
                              iVar17 = (pbVar39[-1] ^ 0xff) * (uint)bVar12;
                              pbVar39[-1] = (byte)((iVar17 + 0x80U >> 8) + iVar17 + 0x80 >> 8);
                              iVar17 = (*pbVar39 ^ 0xff) * (uint)bVar12;
                              *pbVar39 = (byte)((iVar17 + 0x80U >> 8) + iVar17 + 0x80 >> 8);
                              auVar33 = (undefined1  [8])((long)auVar33 + 1);
                              pbVar39 = pbVar39 + (uint)req_comp;
                            } while ((ulong)auVar33 < (stbi_uc *)(ulong)psVar25->img_x);
                          }
                        }
                        else {
                          if (z->app14_color_transform != 0) goto LAB_00175edd;
                          if (psVar25->img_x != 0) {
                            puVar38 = (undefined1 *)
                                      ((long)local_8988 + (ulong)(sVar22 * iVar43) + 3);
                            uVar36 = 0;
                            do {
                              bVar12 = uStack_8900[uVar36];
                              iVar17 = (uint)*(byte *)((long)local_8918 + uVar36) * (uint)bVar12;
                              puVar38[-3] = (char)((iVar17 + 0x80U >> 8) + iVar17 + 0x80 >> 8);
                              iVar17 = (uint)uStack_8910[uVar36] * (uint)bVar12;
                              puVar38[-2] = (char)((iVar17 + 0x80U >> 8) + iVar17 + 0x80 >> 8);
                              puVar38[-1] = (char)(((uint)local_8908[uVar36] * (uint)bVar12 + 0x80
                                                   >> 8) + (uint)local_8908[uVar36] * (uint)bVar12 +
                                                   0x80 >> 8);
                              *puVar38 = 0xff;
                              uVar36 = uVar36 + 1;
                              puVar38 = puVar38 + (uint)req_comp;
                              auVar33 = (undefined1  [8])uStack_8910;
                            } while (uVar36 < psVar25->img_x);
                          }
                        }
                      }
                      else if (psVar25->img_x != 0) {
                        puVar38 = (undefined1 *)((long)local_8988 + (ulong)(sVar22 * iVar43) + 3);
                        psVar29 = (stbi_uc *)0x0;
                        do {
                          sVar11 = *(stbi_uc *)((long)local_8918 + (long)psVar29);
                          puVar38[-1] = sVar11;
                          puVar38[-2] = sVar11;
                          puVar38[-3] = sVar11;
                          *puVar38 = 0xff;
                          psVar29 = psVar29 + 1;
                          auVar33 = (undefined1  [8])(ulong)psVar25->img_x;
                          puVar38 = puVar38 + (uint)req_comp;
                        } while (psVar29 < (ulong)auVar33);
                      }
                    }
                    iVar17 = SUB84(auVar33,0);
                    uVar48 = uVar48 + 1;
                    psVar25 = z->s;
                    iVar43 = iVar43 + req_comp;
                  } while (uVar48 < psVar25->img_y);
                }
                stbi__free_jpeg_components(z,psVar25->img_n,iVar17);
                psVar25 = z->s;
                *local_88f8 = psVar25->img_x;
                *local_88f0 = psVar25->img_y;
                if (local_88d8 != (int *)0x0) {
                  *local_88d8 = (uint)(2 < psVar25->img_n) * 2 + 1;
                }
                goto LAB_00176145;
              }
              stbi__free_jpeg_components(z,psVar25->img_n,iVar17);
              stbi__g_failure_reason = "outofmem";
              goto LAB_0017613c;
            }
            iVar17 = stbi__process_marker(z,(uint)bVar12);
            uVar48 = extraout_EDX_00;
            if (iVar17 != 0) goto LAB_0017522b;
            break;
          }
          psVar25 = z->s;
          sVar11 = stbi__get8(psVar25);
          sVar13 = stbi__get8(psVar25);
          bVar12 = stbi__get8(z->s);
          z->scan_n = (uint)bVar12;
          if (((byte)(bVar12 - 5) < 0xfc) || (z->s->img_n < (int)(uint)bVar12)) {
            stbi__g_failure_reason = "bad SOS component count";
            paVar31 = extraout_RDX_01;
LAB_00176126:
            uVar48 = (uint)paVar31;
            break;
          }
          paVar31 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)CONCAT11(sVar11,sVar13);
          if ((uint)CONCAT11(sVar11,sVar13) != (uint)bVar12 * 2 + 6) {
            stbi__g_failure_reason = "bad SOS len";
            goto LAB_00176126;
          }
          if (bVar12 != 0) {
            lVar24 = 0;
            do {
              bVar12 = stbi__get8(z->s);
              bVar16 = stbi__get8(z->s);
              uVar48 = z->s->img_n;
              if ((int)uVar48 < 1) {
                uVar36 = 0;
              }
              else {
                uVar36 = 0;
                paVar31 = paVar1;
                do {
                  if (paVar31->id == (uint)bVar12) goto LAB_001744cb;
                  uVar36 = uVar36 + 1;
                  paVar31 = paVar31 + 1;
                } while (uVar48 != uVar36);
                uVar36 = (ulong)uVar48;
              }
LAB_001744cb:
              if ((uint)uVar36 == uVar48) goto LAB_0017612d;
              uVar37 = uVar36 & 0xffffffff;
              paVar31 = (anon_struct_96_18_0d0905d3 *)(uVar37 * 0x60);
              z->img_comp[uVar37].hd = (uint)(bVar16 >> 4);
              if (0x3f < bVar16) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_00176126;
              }
              paVar31 = paVar1 + uVar37;
              paVar31->ha = bVar16 & 0xf;
              if (3 < (bVar16 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_00176126;
              }
              z->order[lVar24] = (uint)uVar36;
              lVar24 = lVar24 + 1;
            } while (lVar24 < z->scan_n);
          }
          bVar12 = stbi__get8(z->s);
          z->spec_start = (uint)bVar12;
          bVar12 = stbi__get8(z->s);
          z->spec_end = (uint)bVar12;
          bVar12 = stbi__get8(z->s);
          z->succ_high = (uint)(bVar12 >> 4);
          uVar48 = bVar12 & 0xf;
          paVar31 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar48;
          z->succ_low = uVar48;
          iVar17 = z->progressive;
          iVar43 = z->spec_start;
          if (iVar17 == 0) {
            if (((iVar43 != 0) || (0xf < bVar12)) || ((bVar12 & 0xf) != 0)) goto LAB_00175754;
            z->spec_end = 0x3f;
          }
          else if (((0x3f < iVar43) || (0x3f < z->spec_end)) ||
                  ((z->spec_end < iVar43 || ((0xdf < bVar12 || (0xd < uVar48)))))) {
LAB_00175754:
            stbi__g_failure_reason = "bad SOS";
            goto LAB_00176126;
          }
          iVar43 = z->scan_n;
          uVar36 = (ulong)(uint)z->restart_interval;
          if (z->restart_interval == 0) {
            uVar36 = 0x7fffffff;
          }
          z->code_buffer = 0;
          z->code_bits = 0;
          z->nomore = 0;
          z->img_comp[3].dc_pred = 0;
          z->img_comp[2].dc_pred = 0;
          z->img_comp[1].dc_pred = 0;
          z->img_comp[0].dc_pred = 0;
          z->marker = 0xff;
          uVar48 = (uint)uVar36;
          z->todo = uVar48;
          z->eob_run = 0;
          if (iVar17 == 0) {
            if (iVar43 == 1) {
              iVar17 = z->order[0];
              iVar43 = z->img_comp[iVar17].y + 7 >> 3;
              uVar46 = 1;
              if (0 < iVar43) {
                uVar18 = paVar1[iVar17].x + 7 >> 3;
                iVar19 = 0;
                iVar42 = 0;
                uVar46 = local_8960;
                do {
                  local_8960 = uVar46;
                  if (0 < (int)uVar18) {
                    lVar24 = 0;
                    do {
                      iVar20 = stbi__jpeg_decode_block
                                         (z,(short *)&local_88a8,
                                          (stbi__huffman *)z->huff_dc[paVar1[iVar17].hd].fast,
                                          (stbi__huffman *)z->huff_ac[paVar1[iVar17].ha].fast,
                                          local_88e8[paVar1[iVar17].ha],iVar17,
                                          z->dequant[paVar1[iVar17].tq]);
                      if (iVar20 == 0) {
                        j = (stbi__jpeg *)0x0;
                        uVar46 = 0;
                        uVar36 = extraout_RDX_10;
                      }
                      else {
                        (*z->idct_block_kernel)
                                  (paVar1[iVar17].data + lVar24 + iVar19 * paVar1[iVar17].w2,
                                   paVar1[iVar17].w2,(short *)&local_88a8);
                        iVar20 = z->todo;
                        z->todo = iVar20 + -1;
                        j = (stbi__jpeg *)CONCAT71((int7)((ulong)j >> 8),1);
                        uVar36 = extraout_RDX_11;
                        if (iVar20 < 2) {
                          if (z->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(z);
                            uVar36 = extraout_RDX_12;
                          }
                          if ((z->marker & 0xf8) == 0xd0) {
                            z->code_buffer = 0;
                            z->code_bits = 0;
                            z->nomore = 0;
                            z->img_comp[3].dc_pred = 0;
                            z->img_comp[2].dc_pred = 0;
                            z->img_comp[1].dc_pred = 0;
                            z->img_comp[0].dc_pred = 0;
                            z->marker = 0xff;
                            iVar20 = z->restart_interval;
                            uVar36 = 0x7fffffff;
                            if (iVar20 == 0) {
                              iVar20 = 0x7fffffff;
                            }
                            z->todo = iVar20;
                            z->eob_run = 0;
                          }
                          else {
                            uVar46 = 1;
                            j = (stbi__jpeg *)0x0;
                          }
                        }
                      }
                      uVar48 = (uint)uVar36;
                      local_8960 = uVar46;
                      if ((char)j == '\0') goto LAB_001751d0;
                      lVar24 = lVar24 + 8;
                    } while ((ulong)uVar18 * 8 != lVar24);
                  }
                  uVar48 = (uint)uVar36;
                  iVar42 = iVar42 + 1;
                  iVar19 = iVar19 + 8;
                  uVar46 = local_8960;
                } while (iVar42 != iVar43);
                goto LAB_00174da5;
              }
            }
            else {
              uVar46 = 1;
              if (0 < z->img_mcu_y) {
                iVar17 = 0;
                do {
                  if (0 < z->img_mcu_x) {
                    local_8960 = 0;
                    do {
                      if (0 < z->scan_n) {
                        lVar24 = 0;
                        do {
                          iVar43 = z->order[lVar24];
                          j = (stbi__jpeg *)((long)iVar43 * 0x60);
                          if (0 < z->img_comp[iVar43].v) {
                            j = (stbi__jpeg *)(j->huff_dc[0].fast + (long)(paVar1 + -1) + 0x58);
                            iVar42 = 0;
                            bVar49 = true;
                            do {
                              iVar19 = *(int *)((long)&j->s + 4);
                              if (0 < iVar19) {
                                iVar20 = 0;
                                do {
                                  iVar23 = *(int *)j->huff_dc[0].fast;
                                  iVar21 = *(int *)(j->huff_dc[0].fast + 0xc);
                                  iVar21 = stbi__jpeg_decode_block
                                                     (z,(short *)&local_88a8,
                                                      (stbi__huffman *)
                                                      z->huff_dc[*(int *)(j->huff_dc[0].fast + 8)].
                                                      fast,(stbi__huffman *)z->huff_ac[iVar21].fast,
                                                      local_88e8[iVar21],iVar43,
                                                      z->dequant[*(int *)(j->huff_dc[0].fast + 4)]);
                                  uVar48 = (uint)extraout_RDX_14;
                                  if (iVar21 == 0) {
                                    uVar36 = extraout_RDX_14;
                                    if (!bVar49) goto LAB_001750c1;
                                    goto LAB_001751b4;
                                  }
                                  iVar21 = *(int *)(j->huff_dc[0].fast + 0x1c);
                                  (*z->idct_block_kernel)
                                            ((stbi_uc *)
                                             ((long)(int)((iVar19 * local_8960 + iVar20) * 8) +
                                             (long)((iVar23 * iVar17 + iVar42) * iVar21 * 8) +
                                             *(long *)(j->huff_dc[0].fast + 0x28)),iVar21,
                                             (short *)&local_88a8);
                                  iVar20 = iVar20 + 1;
                                  iVar19 = *(int *)((long)&j->s + 4);
                                  uVar36 = extraout_RDX_15;
                                } while (iVar20 < iVar19);
                              }
                              iVar42 = iVar42 + 1;
                              iVar19 = *(int *)j->huff_dc[0].fast;
                              bVar49 = iVar42 < iVar19;
                            } while (iVar42 < iVar19);
                          }
LAB_001750c1:
                          lVar24 = lVar24 + 1;
                        } while (lVar24 < z->scan_n);
                      }
                      uVar48 = (uint)uVar36;
                      iVar43 = z->todo;
                      z->todo = iVar43 + -1;
                      uVar46 = 1;
                      if (iVar43 < 2) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar48 = extraout_EDX_02;
                        }
                        if ((z->marker & 0xf8) != 0xd0) goto LAB_001751d0;
                        z->code_buffer = 0;
                        z->code_bits = 0;
                        z->nomore = 0;
                        z->img_comp[3].dc_pred = 0;
                        z->img_comp[2].dc_pred = 0;
                        z->img_comp[1].dc_pred = 0;
                        z->img_comp[0].dc_pred = 0;
                        z->marker = 0xff;
                        iVar43 = z->restart_interval;
                        uVar36 = 0x7fffffff;
                        if (iVar43 == 0) {
                          iVar43 = 0x7fffffff;
                        }
                        z->todo = iVar43;
                        z->eob_run = 0;
                      }
                      local_8960 = local_8960 + 1;
                    } while ((int)local_8960 < z->img_mcu_x);
                  }
                  uVar48 = (uint)uVar36;
                  uVar46 = 1;
                  iVar17 = iVar17 + 1;
                } while (iVar17 < z->img_mcu_y);
              }
            }
          }
          else if (iVar43 == 1) {
            local_88c0 = (ulong)z->order[0];
            local_88dc = z->img_comp[local_88c0].y + 7 >> 3;
            uVar46 = 1;
            if (0 < (int)local_88dc) {
              paVar31 = paVar1 + local_88c0;
              iVar17 = z->img_comp[local_88c0].x + 7 >> 3;
              local_8934 = 0;
              local_88d0 = paVar31;
              do {
                if (0 < iVar17) {
                  iVar43 = 0;
                  do {
                    pasVar10 = local_88e8;
                    psVar35 = paVar31->coeff +
                              (int)((paVar31->coeff_w * local_8934 + iVar43) * 0x40);
                    uVar37 = (ulong)z->spec_start;
                    if (uVar37 == 0) {
                      iVar42 = stbi__jpeg_decode_block_prog_dc
                                         (z,psVar35,(stbi__huffman *)z->huff_dc[paVar31->hd].fast,
                                          (int)local_88c0);
                      uVar36 = extraout_RDX_03;
                      if (iVar42 != 0) goto LAB_00174999;
                      bVar49 = false;
                      j = (stbi__jpeg *)0x0;
                    }
                    else {
                      iVar42 = paVar31->ha;
                      psVar29 = z->huff_ac[iVar42].fast;
                      iVar19 = z->eob_run;
                      uVar48 = (uint)j;
                      bVar12 = (byte)z->succ_low;
                      if (z->succ_high == 0) {
                        if (iVar19 == 0) {
                          do {
                            if (z->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(z);
                            }
                            uVar46 = (uint)pasVar10[iVar42][z->code_buffer >> 0x17];
                            iVar19 = (int)uVar37;
                            if (pasVar10[iVar42][z->code_buffer >> 0x17] == 0) {
                              uVar46 = stbi__jpeg_huff_decode(z,(stbi__huffman *)psVar29);
                              if (-1 < (int)uVar46) {
                                uVar18 = uVar46 >> 4;
                                if ((uVar46 & 0xf) == 0) {
                                  if (uVar46 < 0xf0) {
                                    z->eob_run = 1 << ((byte)uVar18 & 0x1f);
                                    if (0xf < uVar46) {
                                      iVar19 = stbi__jpeg_get_bits(z,uVar18);
                                      z->eob_run = z->eob_run + iVar19;
                                    }
                                    z->eob_run = z->eob_run + -1;
                                    iVar19 = 2;
                                    goto LAB_00174b7b;
                                  }
                                  uVar37 = (ulong)(iVar19 + 0x10);
                                  uVar36 = extraout_RDX_08;
                                }
                                else {
                                  uVar37 = (ulong)((int)((long)iVar19 + (ulong)uVar18) + 1);
                                  bVar16 = ""[(long)iVar19 + (ulong)uVar18];
                                  iVar19 = stbi__extend_receive(z,uVar46 & 0xf);
                                  psVar35[bVar16] = (short)(iVar19 << (bVar12 & 0x1f));
                                  uVar36 = extraout_RDX_09;
                                }
                                goto LAB_00174ace;
                              }
                              stbi__g_failure_reason = "bad huffman code";
                              iVar19 = 1;
LAB_00174b7b:
                              uVar36 = 0;
                            }
                            else {
                              z->code_buffer = z->code_buffer << (sbyte)(uVar46 & 0xf);
                              uVar36 = (ulong)(uVar46 >> 4 & 0xf);
                              z->code_bits = z->code_bits - (uVar46 & 0xf);
                              uVar37 = (ulong)((int)((long)iVar19 + uVar36) + 1);
                              psVar35[""[(long)iVar19 + uVar36]] =
                                   (short)((uVar46 >> 8) << (bVar12 & 0x1f));
LAB_00174ace:
                              iVar19 = 0;
                              uVar36 = CONCAT71((int7)(uVar36 >> 8),1);
                            }
                            bVar49 = false;
                            cVar40 = '\x01';
                            if (iVar19 != 0) {
                              bVar49 = false;
                              if (iVar19 != 2) {
                                cVar40 = (char)uVar36;
                                bVar49 = false;
                              }
                              break;
                            }
                          } while ((int)uVar37 <= z->spec_end);
                        }
                        else {
                          z->eob_run = iVar19 + -1;
                          cVar40 = '\0';
                          bVar49 = true;
                        }
                        if (cVar40 != '\0') goto LAB_00174976;
                      }
                      else {
                        if (iVar19 == 0) {
                          uVar46 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                          do {
                            uVar18 = stbi__jpeg_huff_decode(z,(stbi__huffman *)psVar29);
                            uVar36 = extraout_RDX_04;
                            if ((int)uVar18 < 0) {
                              stbi__g_failure_reason = "bad huffman code";
                              bVar49 = false;
                            }
                            else {
                              n = uVar18 >> 4;
                              if ((uVar18 & 0xf) == 1) {
                                iVar19 = stbi__jpeg_get_bit(z);
                                iVar42 = 1;
                                if (iVar19 == 0) {
                                  iVar42 = 0xffff;
                                }
                                local_8960 = iVar42 << (bVar12 & 0x1f);
                                uVar36 = (ulong)local_8960;
                              }
                              else {
                                if ((uVar18 & 0xf) != 0) {
                                  stbi__g_failure_reason = "bad huffman code";
                                  bVar49 = false;
                                  goto LAB_00174961;
                                }
                                if (uVar18 < 0xf0) {
                                  uVar30 = ~(-1 << ((byte)n & 0x1f));
                                  uVar36 = (ulong)uVar30;
                                  z->eob_run = uVar30;
                                  if (0xf < uVar18) {
                                    iVar42 = stbi__jpeg_get_bits(z,n);
                                    z->eob_run = z->eob_run + iVar42;
                                    uVar36 = extraout_RDX_05;
                                  }
                                  local_8960 = 0;
                                  n = 0x40;
                                }
                                else {
                                  local_8960 = 0;
                                  n = 0xf;
                                }
                              }
                              uVar37 = (ulong)(int)uVar37;
                              do {
                                if ((long)z->spec_end < (long)uVar37) break;
                                bVar16 = ""[uVar37];
                                if (psVar35[bVar16] == 0) {
                                  if (n == 0) {
                                    psVar35[bVar16] = (short)local_8960;
                                    bVar49 = false;
                                    n = 0;
                                  }
                                  else {
                                    n = n - 1;
                                    bVar49 = true;
                                  }
                                }
                                else {
                                  iVar42 = stbi__jpeg_get_bit(z);
                                  bVar49 = true;
                                  uVar36 = extraout_RDX_06;
                                  if ((iVar42 != 0) &&
                                     (sVar3 = psVar35[bVar16], (uVar46 & (int)sVar3) == 0)) {
                                    uVar18 = uVar46;
                                    if (sVar3 < 1) {
                                      uVar18 = -uVar46;
                                    }
                                    psVar35[bVar16] = sVar3 + (short)uVar18;
                                  }
                                }
                                uVar37 = uVar37 + 1;
                              } while (bVar49);
                              bVar49 = true;
                            }
LAB_00174961:
                            if (!bVar49) {
                              bVar49 = false;
                              goto LAB_0017497b;
                            }
                          } while ((int)uVar37 <= z->spec_end);
                        }
                        else {
                          z->eob_run = iVar19 + -1;
                          if (z->spec_start <= z->spec_end) {
                            uVar46 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                            do {
                              bVar12 = ""[uVar37];
                              if (((psVar35[bVar12] != 0) &&
                                  (iVar42 = stbi__jpeg_get_bit(z), uVar36 = extraout_RDX_02,
                                  iVar42 != 0)) &&
                                 (sVar3 = psVar35[bVar12], (uVar46 & (int)sVar3) == 0)) {
                                uVar18 = -uVar46;
                                if (0 < sVar3) {
                                  uVar18 = uVar46;
                                }
                                psVar35[bVar12] = (short)uVar18 + sVar3;
                              }
                              bVar49 = (long)uVar37 < (long)z->spec_end;
                              uVar37 = uVar37 + 1;
                            } while (bVar49);
                          }
                        }
LAB_00174976:
                        bVar49 = true;
                      }
LAB_0017497b:
                      if (!bVar49) {
                        uVar48 = 0;
                      }
                      j = (stbi__jpeg *)(ulong)uVar48;
                      paVar31 = local_88d0;
                      if (!bVar49) {
                        bVar49 = false;
                      }
                      else {
LAB_00174999:
                        iVar42 = z->todo;
                        z->todo = iVar42 + -1;
                        bVar49 = true;
                        if (iVar42 < 2) {
                          if (z->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(z);
                            uVar36 = extraout_RDX_07;
                          }
                          if ((z->marker & 0xf8) == 0xd0) {
                            z->code_buffer = 0;
                            z->code_bits = 0;
                            z->nomore = 0;
                            z->img_comp[3].dc_pred = 0;
                            z->img_comp[2].dc_pred = 0;
                            z->img_comp[1].dc_pred = 0;
                            z->img_comp[0].dc_pred = 0;
                            z->marker = 0xff;
                            iVar42 = z->restart_interval;
                            uVar36 = 0x7fffffff;
                            if (iVar42 == 0) {
                              iVar42 = 0x7fffffff;
                            }
                            z->todo = iVar42;
                            z->eob_run = 0;
                          }
                          else {
                            j = (stbi__jpeg *)0x1;
                            bVar49 = false;
                          }
                        }
                      }
                    }
                    uVar48 = (uint)uVar36;
                    if (!bVar49) {
                      uVar46 = (uint)j;
                      goto LAB_001751d0;
                    }
                    iVar43 = iVar43 + 1;
                  } while (iVar43 != iVar17);
                }
                uVar48 = (uint)uVar36;
                local_8934 = local_8934 + 1;
              } while (local_8934 != local_88dc);
LAB_00174da5:
              uVar46 = 1;
            }
          }
          else {
            uVar46 = 1;
            if (0 < z->img_mcu_y) {
              iVar17 = 0;
              do {
                if (0 < z->img_mcu_x) {
                  iVar43 = 0;
                  do {
                    if (0 < z->scan_n) {
                      lVar24 = 0;
                      do {
                        iVar42 = z->order[lVar24];
                        if (0 < z->img_comp[iVar42].v) {
                          iVar19 = 0;
                          bVar49 = true;
LAB_00174e10:
                          iVar20 = paVar1[iVar42].h;
                          if (iVar20 < 1) goto LAB_00174e70;
                          j = (stbi__jpeg *)0x0;
                          while( true ) {
                            iVar20 = stbi__jpeg_decode_block_prog_dc
                                               (z,paVar1[iVar42].coeff +
                                                  (iVar20 * iVar43 + (int)j +
                                                  (paVar1[iVar42].v * iVar17 + iVar19) *
                                                  paVar1[iVar42].coeff_w) * 0x40,
                                                (stbi__huffman *)z->huff_dc[paVar1[iVar42].hd].fast,
                                                iVar42);
                            uVar48 = (uint)extraout_RDX_13;
                            uVar36 = extraout_RDX_13;
                            if (iVar20 == 0) break;
                            uVar48 = (int)j + 1;
                            j = (stbi__jpeg *)(ulong)uVar48;
                            iVar20 = paVar1[iVar42].h;
                            if (iVar20 <= (int)uVar48) goto LAB_00174e70;
                          }
                          if (!bVar49) goto LAB_00174e89;
LAB_001751b4:
                          uVar46 = 0;
                          goto LAB_001751d0;
                        }
LAB_00174e89:
                        lVar24 = lVar24 + 1;
                      } while (lVar24 < z->scan_n);
                    }
                    uVar48 = (uint)uVar36;
                    iVar42 = z->todo;
                    z->todo = iVar42 + -1;
                    uVar46 = 1;
                    if (iVar42 < 2) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                        uVar48 = extraout_EDX_01;
                      }
                      if ((z->marker & 0xf8) != 0xd0) goto LAB_001751d0;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar42 = z->restart_interval;
                      uVar36 = 0x7fffffff;
                      if (iVar42 == 0) {
                        iVar42 = 0x7fffffff;
                      }
                      z->todo = iVar42;
                      z->eob_run = 0;
                    }
                    iVar43 = iVar43 + 1;
                  } while (iVar43 < z->img_mcu_x);
                }
                uVar48 = (uint)uVar36;
                uVar46 = 1;
                iVar17 = iVar17 + 1;
              } while (iVar17 < z->img_mcu_y);
            }
          }
LAB_001751d0:
          if (uVar46 == 0) break;
          if (z->marker == 0xff) {
            do {
              psVar25 = z->s;
              if ((psVar25->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001751fe:
                if (psVar25->img_buffer_end <= psVar25->img_buffer) goto LAB_0017522b;
              }
              else {
                iVar17 = (*(psVar25->io).eof)(psVar25->io_user_data);
                if (iVar17 != 0) {
                  if (psVar25->read_from_callbacks != 0) goto LAB_001751fe;
                  goto LAB_0017522b;
                }
              }
              sVar11 = stbi__get8(z->s);
            } while (sVar11 != 0xff);
            sVar11 = stbi__get8(z->s);
            z->marker = sVar11;
          }
LAB_0017522b:
          bVar12 = stbi__get_marker(z);
          uVar32 = extraout_RDX_16;
        } while( true );
      }
LAB_0017612d:
      stbi__free_jpeg_components(z,z->s->img_n,uVar48);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_0017613c:
    local_8988 = (void *)0x0;
LAB_00176145:
    free(z);
    return local_8988;
  }
  lVar24 = 0;
  do {
    sVar13 = stbi__get8(s);
    sVar11 = (&stbi__check_png_header_png_sig)[lVar24];
    if (sVar13 != sVar11) {
      stbi__g_failure_reason = "bad png sig";
      break;
    }
    lVar24 = lVar24 + 1;
  } while (lVar24 != 8);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar13 == sVar11) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    local_88a8._0_8_ = s;
    iVar17 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
    data_00 = (stbi__uint16 *)local_88a8.history;
    uVar32 = local_88a8._0_8_;
    psVar44 = (stbi__uint16 *)0x0;
    if (iVar17 != 0) {
      iVar17 = 8;
      if (8 < local_88a8.flags) {
        iVar17 = local_88a8.flags;
      }
      ri->bits_per_channel = iVar17;
      local_88a8.history = (stbi_uc *)0x0;
      if ((req_comp != 0) && (iVar17 = *(int *)(local_88a8._0_8_ + 0xc), iVar17 != req_comp)) {
        if (local_88a8.flags < 9) {
          data_00 = (stbi__uint16 *)
                    stbi__convert_format
                              ((uchar *)data_00,iVar17,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                               *(stbi__uint32 *)(local_88a8._0_8_ + 4));
        }
        else {
          data_00 = stbi__convert_format16
                              (data_00,iVar17,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                               *(stbi__uint32 *)(local_88a8._0_8_ + 4));
        }
        *(int *)(uVar32 + 0xc) = req_comp;
        if (data_00 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      *local_88f8 = *(stbi__uint32 *)local_88a8._0_8_;
      *local_88f0 = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
      psVar44 = data_00;
      if (local_88d8 != (int *)0x0) {
        *local_88d8 = *(int *)(local_88a8._0_8_ + 8);
      }
    }
    free(local_88a8.history);
    local_88a8.history = (stbi_uc *)0x0;
    free(local_88a8.background);
    local_88a8.background = (stbi_uc *)0x0;
    free(local_88a8.out);
    return psVar44;
  }
  sVar11 = stbi__get8(s);
  if ((sVar11 != 'B') || (sVar11 = stbi__get8(s), sVar11 != 'M')) {
LAB_0017534f:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar17 = stbi__gif_test(s);
    if (iVar17 != 0) {
      memset(&local_88a8,0,0x8870);
      psVar25 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,local_88d8,0,psVar29);
      if (psVar25 == s) {
        psVar25 = (stbi__context *)0x0;
      }
      if (psVar25 == (stbi__context *)0x0) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        psVar25 = (stbi__context *)0x0;
      }
      else {
        *local_88f8 = local_88a8.w;
        *local_88f0 = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          psVar25 = (stbi__context *)
                    stbi__convert_format((uchar *)psVar25,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      free(local_88a8.background);
      return psVar25;
    }
    sVar22 = stbi__get32be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (sVar22 == 0x38425053) {
      pvVar26 = stbi__psd_load(s,(int *)local_88f8,(int *)local_88f0,local_88d8,req_comp,ri,bpc);
      return pvVar26;
    }
    iVar17 = stbi__pic_test(s);
    piVar47 = local_88d8;
    if (iVar17 != 0) {
      pvVar26 = stbi__pic_load(s,(int *)local_88f8,(int *)local_88f0,local_88d8,req_comp,ri_00);
      return pvVar26;
    }
    iVar17 = stbi__pnm_test(s);
    if (iVar17 == 0) {
      iVar17 = stbi__hdr_test(s);
      psVar9 = local_88f0;
      psVar8 = local_88f8;
      if (iVar17 != 0) {
        data_02 = stbi__hdr_load(s,(int *)local_88f8,(int *)local_88f0,piVar47,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *piVar47;
        }
        psVar29 = stbi__hdr_to_ldr(data_02,*psVar8,*psVar9,req_comp);
        return psVar29;
      }
      iVar17 = stbi__tga_test(s);
      if (iVar17 == 0) {
        stbi__g_failure_reason = "unknown image type";
        return (void *)0x0;
      }
      pvVar26 = stbi__tga_load(s,(int *)local_88f8,(int *)local_88f0,piVar47,req_comp,ri_00);
      return pvVar26;
    }
    pvVar26 = stbi__pnm_load(s,(int *)local_88f8,(int *)local_88f0,piVar47,req_comp,ri_00);
    return pvVar26;
  }
  stbi__get32le(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get32le(s);
  sVar22 = stbi__get32le(s);
  if (((0x38 < sVar22) || ((0x100010000001000U >> ((ulong)sVar22 & 0x3f) & 1) == 0)) &&
     ((sVar22 != 0x7c && (sVar22 != 0x6c)))) goto LAB_0017534f;
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  uStack_8900._4_4_ = 0xff;
  pvVar26 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_8918);
  if (pvVar26 == (void *)0x0) {
    return (void *)0x0;
  }
  local_88b4 = s->img_y;
  sVar22 = -local_88b4;
  if (0 < (int)local_88b4) {
    sVar22 = local_88b4;
  }
  s->img_y = sVar22;
  uVar7 = local_8918._0_4_;
  if ((int)uStack_8910 == 0xc) {
    if ((int)local_8918._0_4_ < 0x18) {
      uVar36 = (ulong)(uint)((local_8918._4_4_ + -0x26) / 3);
    }
    else {
LAB_00175582:
      uVar36 = 0;
    }
  }
  else {
    if (0xf < (int)local_8918._0_4_) goto LAB_00175582;
    uVar36 = (ulong)(uint)((local_8918._4_4_ - (int)uStack_8910) + -0xe >> 2);
  }
  local_8970 = uStack_8900._4_4_;
  uVar48 = (uint)uStack_8900 ^ 0xff000000;
  local_88e8 = (stbi__int16 (*) [512])CONCAT44(local_88e8._4_4_,(uint)uStack_8900);
  s->img_n = 4 - (uint)((uint)uStack_8900 == 0 || local_8918._0_4_ == 0x18 && uVar48 == 0);
  iVar17 = req_comp;
  if (req_comp < 3) {
    iVar17 = s->img_n;
  }
  sVar4 = s->img_x;
  iVar43 = stbi__mad3sizes_valid(iVar17,sVar4,sVar22,0);
  if (iVar43 == 0) {
    stbi__g_failure_reason = "too large";
    return (void *)0x0;
  }
  data_01 = (uchar *)stbi__malloc_mad3(iVar17,sVar4,sVar22,0);
  if (data_01 == (uchar *)0x0) {
    stbi__g_failure_reason = "outofmem";
    return (void *)0x0;
  }
  if ((int)uVar7 < 0x10) {
    iVar43 = (int)uVar36;
    if (0x100 < iVar43 || iVar43 == 0) {
      free(data_01);
      stbi__g_failure_reason = "invalid";
      return (void *)0x0;
    }
    if (0 < iVar43) {
      uVar37 = 0;
      do {
        sVar11 = stbi__get8(s);
        local_88a8.pal[uVar37 - 0xd][2] = sVar11;
        sVar11 = stbi__get8(s);
        local_88a8.pal[uVar37 - 0xd][1] = sVar11;
        sVar11 = stbi__get8(s);
        local_88a8.pal[uVar37 - 0xd][0] = sVar11;
        if ((int)uStack_8910 != 0xc) {
          stbi__get8(s);
        }
        local_88a8.pal[uVar37 - 0xd][3] = 0xff;
        uVar37 = uVar37 + 1;
      } while (uVar36 != uVar37);
    }
    stbi__skip(s,(iVar43 * ((int)uStack_8910 == 0xc | 0xfffffffc) - (int)uStack_8910) +
                 local_8918._4_4_ + -0xe);
    if (uVar7 == 8) {
      uVar48 = s->img_x;
    }
    else if (uVar7 == 4) {
      uVar48 = s->img_x + 1 >> 1;
    }
    else {
      if (uVar7 != 1) {
        free(data_01);
        stbi__g_failure_reason = "bad bpp";
        return (void *)0x0;
      }
      uVar48 = s->img_x + 7 >> 3;
    }
    local_8978 = -uVar48 & 3;
    if (uVar7 == 1) {
      if (0 < (int)s->img_y) {
        iVar43 = 0;
        iVar42 = 0;
        do {
          bVar12 = stbi__get8(s);
          uVar48 = (uint)bVar12;
          uVar46 = 7;
          sVar22 = 1;
          do {
            sVar4 = s->img_x;
            if ((int)sVar4 <= (int)(sVar22 - 1)) break;
            uVar36 = (ulong)((uVar48 >> (uVar46 & 0x1f) & 1) != 0);
            data_01[iVar43] = local_88a8.pal[uVar36 - 0xd][0];
            data_01[(long)iVar43 + 1] = local_88a8.pal[uVar36 - 0xd][1];
            data_01[(long)iVar43 + 2] = local_88a8.pal[uVar36 - 0xd][2];
            iVar19 = iVar43 + 3;
            if (iVar17 == 4) {
              data_01[(long)iVar43 + 3] = 0xff;
              iVar19 = iVar43 + 4;
            }
            iVar43 = iVar19;
            if (sVar22 != sVar4) {
              if ((int)uVar46 < 1) {
                bVar12 = stbi__get8(s);
                uVar48 = (uint)bVar12;
                uVar46 = 7;
              }
              else {
                uVar46 = uVar46 - 1;
              }
            }
            bVar49 = sVar22 != sVar4;
            sVar22 = sVar22 + 1;
          } while (bVar49);
          stbi__skip(s,local_8978);
          iVar42 = iVar42 + 1;
        } while (iVar42 < (int)s->img_y);
      }
    }
    else if (0 < (int)s->img_y) {
      uVar36 = 0;
      iVar43 = 0;
      do {
        if (0 < (int)s->img_x) {
          iVar42 = 0;
          do {
            bVar12 = stbi__get8(s);
            uVar46 = bVar12 & 0xf;
            uVar48 = (uint)(bVar12 >> 4);
            if (uVar7 != 4) {
              uVar48 = (uint)bVar12;
            }
            uVar37 = (ulong)uVar48;
            if (uVar7 != 4) {
              uVar46 = 0;
            }
            lVar24 = (long)(int)uVar36;
            uVar41 = lVar24 + 3;
            data_01[lVar24] = local_88a8.pal[uVar37 - 0xd][0];
            data_01[lVar24 + 1] = local_88a8.pal[uVar37 - 0xd][1];
            data_01[lVar24 + 2] = local_88a8.pal[uVar37 - 0xd][2];
            if (iVar17 == 4) {
              data_01[lVar24 + 3] = 0xff;
              uVar41 = (ulong)((int)uVar36 + 4);
            }
            sVar22 = s->img_x;
            if (iVar42 + 1U == sVar22) {
LAB_0017691d:
              uVar36 = uVar41 & 0xffffffff;
            }
            else {
              if (uVar7 == 8) {
                bVar12 = stbi__get8(s);
                uVar46 = (uint)bVar12;
              }
              lVar24 = (long)(int)uVar41;
              uVar36 = lVar24 + 3;
              uVar37 = (ulong)uVar46;
              data_01[lVar24] = local_88a8.pal[uVar37 - 0xd][0];
              data_01[lVar24 + 1] = local_88a8.pal[uVar37 - 0xd][1];
              data_01[lVar24 + 2] = local_88a8.pal[uVar37 - 0xd][2];
              if (iVar17 == 4) {
                uVar41 = (ulong)((int)uVar41 + 4);
                data_01[lVar24 + 3] = 0xff;
                goto LAB_0017691d;
              }
            }
          } while ((iVar42 + 1U != sVar22) && (iVar42 = iVar42 + 2, iVar42 < (int)s->img_x));
        }
        stbi__skip(s,local_8978);
        iVar43 = iVar43 + 1;
      } while (iVar43 < (int)s->img_y);
    }
    goto LAB_00176955;
  }
  psVar25 = s;
  stbi__skip(s,(local_8918._4_4_ - (int)uStack_8910) + -0xe);
  if (uVar7 == 0x18) {
    iVar43 = -3;
LAB_001762b4:
    local_88b0 = iVar43 * s->img_x & 3;
  }
  else {
    local_88b0 = 0;
    if (uVar7 == 0x10) {
      iVar43 = -2;
      goto LAB_001762b4;
    }
  }
  iVar43 = 0;
  if (uVar7 == 0x18) {
    uVar36 = 0;
LAB_00176309:
    local_88d0 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88d0._4_4_ << 0x20);
  }
  else {
    uVar34 = (undefined7)((ulong)psVar25 >> 8);
    if (uVar7 != 0x20) {
      uVar36 = CONCAT71(uVar34,1);
      goto LAB_00176309;
    }
    uVar48 = uStack_8910._4_4_ ^ 0xff0000 | (uint)local_8908 ^ 0xff00 | local_8908._4_4_ ^ 0xff |
             uVar48;
    local_88d0 = (anon_struct_96_18_0d0905d3 *)
                 CONCAT44(local_88d0._4_4_,CONCAT31((int3)(uVar48 >> 8),uVar48 == 0));
    uVar36 = CONCAT71(uVar34,uVar48 != 0);
  }
  iVar42 = 0;
  local_8934 = 0;
  local_88c0 = local_88c0 & 0xffffffff00000000;
  uVar48 = 0;
  uVar46 = 0;
  local_8924 = 0;
  local_88dc = 0;
  local_88c4 = (uint)uVar36;
  if ((char)uVar36 == '\0') {
LAB_00176504:
    bVar49 = true;
    if (0 < (int)s->img_y) {
      iVar20 = 0;
      iVar19 = 0;
      do {
        local_88ac = iVar19;
        if ((char)uVar36 == '\0') {
          if (0 < (int)s->img_x) {
            iVar19 = 0;
            do {
              sVar11 = stbi__get8(s);
              data_01[(long)iVar20 + 2] = sVar11;
              sVar11 = stbi__get8(s);
              data_01[(long)iVar20 + 1] = sVar11;
              sVar11 = stbi__get8(s);
              data_01[iVar20] = sVar11;
              bVar12 = 0xff;
              if ((char)local_88d0 != '\0') {
                bVar12 = stbi__get8(s);
              }
              iVar23 = iVar20 + 3;
              if (iVar17 == 4) {
                data_01[(long)iVar20 + 3] = bVar12;
                iVar23 = iVar20 + 4;
              }
              iVar20 = iVar23;
              local_8970 = local_8970 | bVar12;
              iVar19 = iVar19 + 1;
            } while (iVar19 < (int)s->img_x);
          }
        }
        else if (0 < (int)s->img_x) {
          iVar19 = 0;
          do {
            if (uVar7 == 0x10) {
              sVar11 = stbi__get8(s);
              sVar13 = stbi__get8(s);
              sVar22 = (stbi__uint32)CONCAT11(sVar13,sVar11);
            }
            else {
              sVar22 = stbi__get32le(s);
            }
            iVar23 = stbi__shiftsigned(sVar22 & uStack_8910._4_4_,iVar43,uVar48);
            data_01[iVar20] = (uchar)iVar23;
            iVar23 = stbi__shiftsigned(sVar22 & (uint)local_8908,iVar42,uVar46);
            data_01[(long)iVar20 + 1] = (uchar)iVar23;
            iVar23 = stbi__shiftsigned(sVar22 & local_8908._4_4_,local_8934,local_8924);
            data_01[(long)iVar20 + 2] = (uchar)iVar23;
            if ((uint)local_88e8 == 0) {
              uVar18 = 0xff;
            }
            else {
              uVar18 = stbi__shiftsigned(sVar22 & (uint)local_88e8,(int)local_88c0,local_88dc);
            }
            iVar23 = iVar20 + 3;
            if (iVar17 == 4) {
              data_01[(long)iVar20 + 3] = (uchar)uVar18;
              iVar23 = iVar20 + 4;
            }
            iVar20 = iVar23;
            local_8970 = local_8970 | uVar18;
            iVar19 = iVar19 + 1;
          } while (iVar19 < (int)s->img_x);
        }
        stbi__skip(s,local_88b0);
        iVar19 = local_88ac + 1;
        uVar36 = (ulong)local_88c4;
      } while (iVar19 < (int)s->img_y);
      bVar49 = true;
    }
  }
  else {
    if (((uint)local_8908 != 0 && uStack_8910._4_4_ != 0) && local_8908._4_4_ != 0) {
      iVar43 = stbi__high_bit(uStack_8910._4_4_);
      iVar43 = iVar43 + -7;
      uVar48 = (uStack_8910._4_4_ >> 1 & 0x55555555) + (uStack_8910._4_4_ & 0x55555555);
      uVar48 = (uVar48 >> 2 & 0x33333333) + (uVar48 & 0x33333333);
      uVar48 = (uVar48 >> 4) + uVar48 & 0xf0f0f0f;
      uVar48 = (uVar48 >> 8) + uVar48;
      uVar48 = (uVar48 >> 0x10) + uVar48 & 0xff;
      iVar42 = stbi__high_bit((uint)local_8908);
      iVar42 = iVar42 + -7;
      uVar46 = ((uint)local_8908 >> 1 & 0x55555555) + ((uint)local_8908 & 0x55555555);
      uVar46 = (uVar46 >> 2 & 0x33333333) + (uVar46 & 0x33333333);
      uVar46 = (uVar46 >> 4) + uVar46 & 0xf0f0f0f;
      uVar46 = (uVar46 >> 8) + uVar46;
      uVar46 = (uVar46 >> 0x10) + uVar46 & 0xff;
      iVar19 = stbi__high_bit(local_8908._4_4_);
      local_8934 = iVar19 + -7;
      uVar18 = (local_8908._4_4_ >> 1 & 0x55555555) + (local_8908._4_4_ & 0x55555555);
      uVar18 = (uVar18 >> 2 & 0x33333333) + (uVar18 & 0x33333333);
      uVar18 = (uVar18 >> 4) + uVar18 & 0xf0f0f0f;
      uVar18 = (uVar18 >> 8) + uVar18;
      local_8924 = (uVar18 >> 0x10) + uVar18 & 0xff;
      uVar18 = (uint)local_88e8;
      iVar19 = stbi__high_bit((uint)local_88e8);
      uVar36 = (ulong)local_88c4;
      local_88c0 = CONCAT44(local_88c0._4_4_,iVar19 + -7);
      uVar18 = (uVar18 >> 1 & 0x55555555) + (uVar18 & 0x55555555);
      uVar18 = (uVar18 >> 2 & 0x33333333) + (uVar18 & 0x33333333);
      uVar18 = (uVar18 >> 4) + uVar18 & 0xf0f0f0f;
      uVar18 = (uVar18 >> 8) + uVar18;
      local_88dc = (uVar18 >> 0x10) + uVar18 & 0xff;
      goto LAB_00176504;
    }
    free(data_01);
    stbi__g_failure_reason = "bad masks";
    bVar49 = false;
  }
  if (!bVar49) {
    return (void *)0x0;
  }
LAB_00176955:
  if (((iVar17 == 4) && (local_8970 == 0)) && (iVar43 = s->img_x * s->img_y * 4, -1 < iVar43 + -1))
  {
    lVar24 = (ulong)(iVar43 - 4) + 7;
    do {
      data_01[lVar24 + -4] = 0xff;
      lVar24 = lVar24 + -4;
    } while (3 < lVar24);
  }
  if (0 < (int)local_88b4) {
    uVar48 = (int)s->img_y >> 1;
    if (0 < (int)uVar48) {
      uVar18 = s->img_x * iVar17;
      uVar46 = (s->img_y - 1) * uVar18;
      uVar36 = 0;
      uVar37 = 0;
      do {
        if (0 < (int)uVar18) {
          uVar41 = 0;
          do {
            uVar2 = data_01[uVar41 + uVar36];
            data_01[uVar41 + uVar36] = data_01[uVar41 + uVar46];
            data_01[uVar41 + uVar46] = uVar2;
            uVar41 = uVar41 + 1;
          } while (uVar18 != uVar41);
        }
        uVar37 = uVar37 + 1;
        uVar46 = uVar46 - uVar18;
        uVar36 = (ulong)((int)uVar36 + uVar18);
      } while (uVar37 != uVar48);
    }
  }
  if ((iVar17 != req_comp && req_comp != 0) &&
     (data_01 = stbi__convert_format(data_01,iVar17,req_comp,s->img_x,s->img_y),
     data_01 == (uchar *)0x0)) {
    return (void *)0x0;
  }
  *local_88f8 = s->img_x;
  *local_88f0 = s->img_y;
  if (local_88d8 != (int *)0x0) {
    *local_88d8 = s->img_n;
    return data_01;
  }
  return data_01;
LAB_00174e70:
  iVar19 = iVar19 + 1;
  bVar49 = iVar19 < paVar1[iVar42].v;
  if (paVar1[iVar42].v <= iVar19) goto LAB_00174e89;
  goto LAB_00174e10;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}